

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

void __thiscall Liby::EventLoopGroup::~EventLoopGroup(EventLoopGroup *this)

{
  pointer ptVar1;
  pointer ptVar2;
  
  ptVar1 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  std::_Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>::~_Vector_base
            (&(this->ploops_).
              super__Vector_base<Liby::EventLoop_*,_std::allocator<Liby::EventLoop_*>_>);
  std::vector<std::shared_ptr<Liby::EventLoop>,_std::allocator<std::shared_ptr<Liby::EventLoop>_>_>
  ::~vector(&this->loops_);
  std::__cxx11::string::~string((string *)&this->chooser_);
  std::_Function_base::~_Function_base(&(this->bf_).super__Function_base);
  return;
}

Assistant:

EventLoopGroup::~EventLoopGroup() {
    for (auto &th : threads_) {
        if (th.joinable()) {
            th.join();
        }
    }
}